

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int session_close_stream_on_goaway(nghttp2_session *session,int32_t last_stream_id,int incoming)

{
  long lVar1;
  int iVar2;
  long lVar3;
  nghttp2_close_stream_on_goaway_arg arg;
  nghttp2_session *local_28;
  long local_20;
  int32_t local_18;
  int local_14;
  
  local_20 = 0;
  local_28 = session;
  local_18 = last_stream_id;
  local_14 = incoming;
  iVar2 = nghttp2_map_each(&session->streams,find_stream_on_goaway_func,&local_28);
  lVar3 = local_20;
  if (iVar2 != 0) {
    __assert_fail("rv == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0xb09,"int session_close_stream_on_goaway(nghttp2_session *, int32_t, int)");
  }
  do {
    if (lVar3 == 0) {
      return 0;
    }
    lVar1 = *(long *)(lVar3 + 0x88);
    *(undefined8 *)(lVar3 + 0x88) = 0;
    iVar2 = nghttp2_session_close_stream(session,*(int32_t *)(lVar3 + 0xa8),7);
    lVar3 = lVar1;
  } while (-0x385 < iVar2);
  while (lVar1 != 0) {
    lVar3 = *(long *)(lVar1 + 0x88);
    *(undefined8 *)(lVar1 + 0x88) = 0;
    lVar1 = lVar3;
  }
  return iVar2;
}

Assistant:

static int session_close_stream_on_goaway(nghttp2_session *session,
                                          int32_t last_stream_id,
                                          int incoming) {
  int rv;
  nghttp2_stream *stream, *next_stream;
  nghttp2_close_stream_on_goaway_arg arg = {session, NULL, last_stream_id,
                                            incoming};

  rv = nghttp2_map_each(&session->streams, find_stream_on_goaway_func, &arg);
  assert(rv == 0);

  stream = arg.head;
  while (stream) {
    next_stream = stream->closed_next;
    stream->closed_next = NULL;
    rv = nghttp2_session_close_stream(session, stream->stream_id,
                                      NGHTTP2_REFUSED_STREAM);

    /* stream may be deleted here */

    stream = next_stream;

    if (nghttp2_is_fatal(rv)) {
      /* Clean up closed_next member just in case */
      while (stream) {
        next_stream = stream->closed_next;
        stream->closed_next = NULL;
        stream = next_stream;
      }
      return rv;
    }
  }

  return 0;
}